

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.cpp
# Opt level: O2

void __thiscall icu_63::UnifiedCache::_runEvictionSlice(UnifiedCache *this)

{
  SharedObject *value;
  UBool UVar1;
  int32_t iVar2;
  UHashElement *element;
  int iVar3;
  bool bVar4;
  
  iVar2 = _computeCountOfItemsToEvict(this);
  if (0 < iVar2) {
    iVar3 = 10;
    do {
      do {
        bVar4 = iVar3 == 0;
        iVar3 = iVar3 + -1;
        if (bVar4) {
          return;
        }
        element = _nextElement(this);
        if (element == (UHashElement *)0x0) {
          return;
        }
        UVar1 = _isEvictable(this,element);
      } while (UVar1 == '\0');
      value = (SharedObject *)(element->value).pointer;
      uhash_removeElement_63(this->fHashtable,element);
      removeSoftRef(this,value);
      this->fAutoEvictedCount = this->fAutoEvictedCount + 1;
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  return;
}

Assistant:

void UnifiedCache::_runEvictionSlice() const {
    int32_t maxItemsToEvict = _computeCountOfItemsToEvict();
    if (maxItemsToEvict <= 0) {
        return;
    }
    for (int32_t i = 0; i < MAX_EVICT_ITERATIONS; ++i) {
        const UHashElement *element = _nextElement();
        if (element == nullptr) {
            break;
        }
        if (_isEvictable(element)) {
            const SharedObject *sharedObject =
                    (const SharedObject *) element->value.pointer;
            uhash_removeElement(fHashtable, element);
            removeSoftRef(sharedObject);   // Deletes sharedObject when SoftRefCount goes to zero.
            ++fAutoEvictedCount;
            if (--maxItemsToEvict == 0) {
                break;
            }
        }
    }
}